

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

long __thiscall FileReaderBZ2::Read(FileReaderBZ2 *this,void *buffer,long len)

{
  bool bVar1;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int err;
  long len_local;
  void *buffer_local;
  FileReaderBZ2 *this_local;
  
  (this->Stream).next_out = (char *)buffer;
  (this->Stream).avail_out = (uint)len;
  do {
    in_stack_ffffffffffffffdc =
         BZ2_bzDecompress((bz_stream *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                         );
    if (((this->Stream).avail_in == 0) && ((this->SawEOF & 1U) == 0)) {
      FillBuffer(this);
    }
    bVar1 = false;
    if (in_stack_ffffffffffffffdc == 0) {
      bVar1 = (this->Stream).avail_out != 0;
    }
  } while (bVar1);
  if ((in_stack_ffffffffffffffdc != 0) && (in_stack_ffffffffffffffdc != 4)) {
    I_Error("Corrupt bzip2 stream");
  }
  if ((this->Stream).avail_out != 0) {
    I_Error("Ran out of data in bzip2 stream");
  }
  return len - (ulong)(this->Stream).avail_out;
}

Assistant:

long FileReaderBZ2::Read (void *buffer, long len)
{
	int err;

	Stream.next_out = (char *)buffer;
	Stream.avail_out = len;

	do
	{
		err = BZ2_bzDecompress(&Stream);
		if (Stream.avail_in == 0 && !SawEOF)
		{
			FillBuffer ();
		}
	} while (err == BZ_OK && Stream.avail_out != 0);

	if (err != BZ_OK && err != BZ_STREAM_END)
	{
		I_Error ("Corrupt bzip2 stream");
	}

	if (Stream.avail_out != 0)
	{
		I_Error ("Ran out of data in bzip2 stream");
	}

	return len - Stream.avail_out;
}